

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::GenerateBlockSymbol*>::
emplace_back<slang::ast::GenerateBlockSymbol*const&>
          (SmallVectorBase<slang::ast::GenerateBlockSymbol*> *this,GenerateBlockSymbol **args)

{
  long lVar1;
  reference ppGVar2;
  pointer ppGVar3;
  
  lVar1 = *(long *)(this + 8);
  ppGVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppGVar3 = emplaceRealloc<slang::ast::GenerateBlockSymbol*const&>(this,ppGVar3,args);
    return ppGVar3;
  }
  *ppGVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppGVar2 = SmallVectorBase<slang::ast::GenerateBlockSymbol_*>::back
                      ((SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *)this);
  return ppGVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }